

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O3

void issue538b(void)

{
  uint8_t *puVar1;
  _Bool _Var2;
  roaring_bitmap_t *r;
  roaring_bitmap_t *r2;
  roaring_bitmap_t *r1;
  roaring_bitmap_t *r_00;
  uint64_t uVar3;
  uint64_t uVar4;
  
  r = roaring_bitmap_from_range(0x20002,0x20324,1);
  puVar1 = &(r->high_low_container).flags;
  *puVar1 = *puVar1 | 1;
  r2 = roaring_bitmap_copy(r);
  r1 = roaring_bitmap_add_offset(r,-0x10000);
  roaring_bitmap_equals(r,r2);
  r_00 = roaring_bitmap_from_range(0x10002,0x10324,1);
  puVar1 = &(r_00->high_low_container).flags;
  *puVar1 = *puVar1 | 1;
  uVar3 = roaring_bitmap_get_cardinality(r);
  uVar4 = roaring_bitmap_get_cardinality(r_00);
  _assert_true((ulong)(uVar3 == uVar4),
               "roaring_bitmap_get_cardinality(toshift) == roaring_bitmap_get_cardinality(expected)"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x12b8);
  _Var2 = roaring_bitmap_equals(r1,r_00);
  _assert_true((ulong)_Var2,"roaring_bitmap_equals(shifted, expected)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x12b9);
  roaring_bitmap_free(r2);
  roaring_bitmap_free(r);
  roaring_bitmap_free(r1);
  roaring_bitmap_free(r_00);
  return;
}

Assistant:

DEFINE_TEST(issue538b) {
    int shift = -65536;
    roaring_bitmap_t *toshift = roaring_bitmap_from_range(131074, 131876, 1);
    roaring_bitmap_set_copy_on_write(toshift, 1);
    roaring_bitmap_t *toshift_copy = roaring_bitmap_copy(toshift);

    roaring_bitmap_t *shifted = roaring_bitmap_add_offset(toshift, shift);
    roaring_bitmap_equals(toshift, toshift_copy);

    roaring_bitmap_t *expected =
        roaring_bitmap_from_range(131074 + shift, 131876 + shift, 1);
    roaring_bitmap_set_copy_on_write(expected, 1);
    assert_true(roaring_bitmap_get_cardinality(toshift) ==
                roaring_bitmap_get_cardinality(expected));
    assert_true(roaring_bitmap_equals(shifted, expected));
    roaring_bitmap_free(toshift_copy);
    roaring_bitmap_free(toshift);
    roaring_bitmap_free(shifted);
    roaring_bitmap_free(expected);
}